

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch2sin.cc
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ostream *this;
  size_t sVar5;
  char *__s;
  double *sawtooth;
  _func_int **pp_Var6;
  int iVar7;
  string *input_stream;
  double *sin;
  _func_int **pp_Var8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  double *cos;
  int interpolation_period;
  int frame_period;
  double unvoiced_value;
  double signal;
  ostringstream error_message_7;
  PeriodicWaveformGeneration waveform_generation;
  ifstream ifs;
  InputSourceInterpolationWithMagicNumber input_source_interpolation_with_magic_number;
  InputSourceFromStream input_source_from_stream;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  undefined8 local_4d0;
  double local_4c8;
  undefined1 local_4c0 [32];
  double local_4a0;
  string local_498 [3];
  ios_base local_428 [264];
  undefined1 local_320 [32];
  bool local_300;
  string local_2e0;
  byte abStack_2c0 [80];
  ios_base local_270 [408];
  InputSourceInterpolationWithMagicNumber local_d8;
  InputSourceFromStream local_50;
  
  local_4d8 = 100;
  local_4dc = 1;
  local_4c8 = 0.0;
  local_4d0 = 0;
  local_4d4 = 0;
  iVar7 = 0;
  do {
    paVar9 = &local_498[0].field_2;
    iVar4 = ya_getopt_long(argc,argv,"p:i:o:u:sh",(option *)0x0,(int *)0x0);
    if (0xd < iVar4 - 0x68U) {
      if (iVar4 != -1) goto switchD_001037d1_caseD_6a;
      iVar4 = 2;
      goto LAB_00103bae;
    }
    switch(iVar4) {
    case 0x68:
      anon_unknown.dwarf_1fec::PrintUsage((ostream *)&std::cout);
      iVar7 = 0;
      iVar4 = 1;
      goto LAB_00103bae;
    case 0x69:
      std::__cxx11::string::string((string *)&local_2e0,ya_optarg,(allocator *)local_498);
      bVar2 = sptk::ConvertStringToInteger(&local_2e0,&local_4dc);
      bVar1 = local_4dc < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      if (!bVar2 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2e0,"The argument for the -i option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2e0,"non-negative integer",0x14);
        local_498[0]._M_dataplus._M_p = (pointer)&local_498[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"pitch2sin","");
        sptk::PrintErrorMessage(local_498,(ostringstream *)&local_2e0);
LAB_00103b78:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
          operator_delete(local_498[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2e0);
        std::ios_base::~ios_base(local_270);
        goto LAB_00103ba3;
      }
      break;
    default:
switchD_001037d1_caseD_6a:
      anon_unknown.dwarf_1fec::PrintUsage((ostream *)&std::cerr);
LAB_00103ba3:
      iVar4 = 1;
      iVar7 = 1;
      goto LAB_00103bae;
    case 0x6f:
      std::__cxx11::string::string((string *)&local_2e0,ya_optarg,(allocator *)local_498);
      bVar2 = sptk::ConvertStringToInteger(&local_2e0,(int *)&local_d8);
      if (bVar2) {
        bVar2 = sptk::IsInRange((int)local_d8.super_InputSourceInterface._vptr_InputSourceInterface,
                                0,2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p);
        }
        if (!bVar2) goto LAB_00103a48;
        iVar4 = 4;
        bVar2 = true;
        local_4d4 = (int)local_d8.super_InputSourceInterface._vptr_InputSourceInterface;
      }
      else {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p);
        }
LAB_00103a48:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2e0,"The argument for the -o option must be an integer ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2e0,"in the range of ",0x10);
        this = (ostream *)std::ostream::operator<<((ostream *)&local_2e0,0);
        std::__ostream_insert<char,std::char_traits<char>>(this," to ",4);
        std::ostream::operator<<((ostream *)this,2);
        local_498[0]._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"pitch2sin","");
        sptk::PrintErrorMessage(local_498,(ostringstream *)&local_2e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498[0]._M_dataplus._M_p != paVar9) {
          operator_delete(local_498[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2e0);
        std::ios_base::~ios_base(local_270);
        iVar4 = 1;
        bVar2 = false;
        iVar7 = 1;
      }
      if (bVar2) break;
      goto LAB_00103bae;
    case 0x70:
      std::__cxx11::string::string((string *)&local_2e0,ya_optarg,(allocator *)local_498);
      bVar1 = sptk::ConvertStringToInteger(&local_2e0,&local_4d8);
      bVar2 = local_4d8 < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      if (!bVar1 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2e0,"The argument for the -p option must be a positive integer"
                   ,0x39);
        local_498[0]._M_dataplus._M_p = (pointer)&local_498[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"pitch2sin","");
        sptk::PrintErrorMessage(local_498,(ostringstream *)&local_2e0);
        goto LAB_00103b78;
      }
      break;
    case 0x73:
      local_4d0 = CONCAT71((int7)((ulong)((long)&switchD_001037d1::switchdataD_0010c004 +
                                         (long)(int)(&switchD_001037d1::switchdataD_0010c004)
                                                    [iVar4 - 0x68U]) >> 8),1);
      break;
    case 0x75:
      std::__cxx11::string::string((string *)&local_2e0,ya_optarg,(allocator *)local_498);
      bVar2 = sptk::ConvertStringToDouble(&local_2e0,&local_4c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2e0,"The argument for the -u option must be a number",0x2f);
        local_498[0]._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"pitch2sin","");
        sptk::PrintErrorMessage(local_498,(ostringstream *)&local_2e0);
        goto LAB_00103b78;
      }
    }
    iVar4 = 0;
LAB_00103bae:
    paVar9 = &local_498[0].field_2;
  } while (iVar4 == 0);
  if (iVar4 == 2) {
    if (local_4d8 / 2 < local_4dc) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2e0,"Interpolation period must be equal to or less than half ",
                 0x38);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e0,"frame period",0xc);
      local_498[0]._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"pitch2sin","");
      sptk::PrintErrorMessage(local_498,(ostringstream *)&local_2e0);
    }
    else if (argc - ya_optind < 2) {
      if (argc == ya_optind) {
        __s = (char *)0x0;
      }
      else {
        __s = argv[ya_optind];
      }
      bVar2 = sptk::SetBinaryMode();
      if (bVar2) {
        input_stream = &local_2e0;
        std::ifstream::ifstream(input_stream);
        if ((__s == (char *)0x0) ||
           (std::ifstream::open((char *)&local_2e0,(_Ios_Openmode)__s),
           (abStack_2c0[*(long *)(local_2e0._M_dataplus._M_p + -0x18)] & 5) == 0)) {
          cVar3 = std::__basic_file<char>::is_open();
          if (cVar3 == '\0') {
            input_stream = (string *)&std::cin;
          }
          sptk::InputSourceFromStream::InputSourceFromStream
                    (&local_50,false,1,(istream *)input_stream);
          sptk::InputSourceInterpolationWithMagicNumber::InputSourceInterpolationWithMagicNumber
                    (&local_d8,local_4d8,local_4dc,false,0.0,&local_50.super_InputSourceInterface);
          if (local_d8.is_valid_ == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_498,"Failed to initialize InputSourceFromStream",0x2a);
            pp_Var8 = (_func_int **)(local_320 + 0x10);
            local_320._0_8_ = pp_Var8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"pitch2sin","");
            sptk::PrintErrorMessage((string *)local_320,(ostringstream *)local_498);
            pp_Var6 = (_func_int **)local_320._0_8_;
          }
          else {
            sptk::PeriodicWaveformGeneration::PeriodicWaveformGeneration
                      ((PeriodicWaveformGeneration *)local_320,local_4c8,(bool)((byte)local_4d0 & 1)
                       ,&local_d8);
            if (local_300 == false) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_498,"Failed to initialize PeriodicWaveformGeneration",0x2f
                        );
              local_4c0._0_8_ = local_4c0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"pitch2sin","");
              sptk::PrintErrorMessage((string *)local_4c0,(ostringstream *)local_498);
            }
            else {
              sin = (double *)0x0;
              if (local_4d4 == 0) {
                sin = &local_4a0;
              }
              cos = (double *)0x0;
              if (local_4d4 == 1) {
                cos = &local_4a0;
              }
              sawtooth = &local_4a0;
              if (local_4d4 != 2) {
                sawtooth = (double *)0x0;
              }
              do {
                bVar2 = sptk::PeriodicWaveformGeneration::Get
                                  ((PeriodicWaveformGeneration *)local_320,sin,cos,sawtooth,
                                   (double *)0x0);
                if (!bVar2) {
                  iVar7 = 0;
                  goto LAB_00104086;
                }
                bVar2 = sptk::WriteStream<double>(local_4a0,(ostream *)&std::cout);
              } while (bVar2);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_498,"Failed to write a periodic waveform",0x23);
              local_4c0._0_8_ = local_4c0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"pitch2sin","");
              sptk::PrintErrorMessage((string *)local_4c0,(ostringstream *)local_498);
            }
            pp_Var8 = (_func_int **)(local_4c0 + 0x10);
            pp_Var6 = (_func_int **)local_4c0._0_8_;
          }
          if (pp_Var6 != pp_Var8) {
            operator_delete(pp_Var6);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
          std::ios_base::~ios_base(local_428);
          iVar7 = 1;
LAB_00104086:
          sptk::InputSourceInterpolationWithMagicNumber::~InputSourceInterpolationWithMagicNumber
                    (&local_d8);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_498,"Cannot open file ",0x11);
          sVar5 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,__s,sVar5);
          local_d8.super_InputSourceInterface._vptr_InputSourceInterface =
               (_func_int **)&local_d8.first_interpolation_period_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"pitch2sin","");
          sptk::PrintErrorMessage((string *)&local_d8,(ostringstream *)local_498);
          if (local_d8.super_InputSourceInterface._vptr_InputSourceInterface !=
              (_func_int **)&local_d8.first_interpolation_period_) {
            operator_delete(local_d8.super_InputSourceInterface._vptr_InputSourceInterface);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
          std::ios_base::~ios_base(local_428);
          iVar7 = 1;
        }
        std::ifstream::~ifstream(&local_2e0);
        return iVar7;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2e0,"Cannot set translation mode",0x1b);
      local_498[0]._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"pitch2sin","");
      sptk::PrintErrorMessage(local_498,(ostringstream *)&local_2e0);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2e0,"Too many input files",0x14);
      local_498[0]._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"pitch2sin","");
      sptk::PrintErrorMessage(local_498,(ostringstream *)&local_2e0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498[0]._M_dataplus._M_p != paVar9) {
      operator_delete(local_498[0]._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2e0);
    std::ios_base::~ios_base(local_270);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

int main(int argc, char* argv[]) {
  int frame_period(kDefaultFramePeriod);
  int interpolation_period(kDefaultInterpolationPeriod);
  OutputFormats output_format(kDefaultOutputFormat);
  double unvoiced_value(kDefaultUnvoicedValue);
  bool strict(kDefaultStrictFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "p:i:o:u:sh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'p': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_period) ||
            frame_period <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive integer";
          sptk::PrintErrorMessage("pitch2sin", error_message);
          return 1;
        }
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &interpolation_period) ||
            interpolation_period < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -i option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("pitch2sin", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("pitch2sin", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'u': {
        if (!sptk::ConvertStringToDouble(optarg, &unvoiced_value)) {
          std::ostringstream error_message;
          error_message << "The argument for the -u option must be a number";
          sptk::PrintErrorMessage("pitch2sin", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        strict = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (frame_period / 2 < interpolation_period) {
    std::ostringstream error_message;
    error_message << "Interpolation period must be equal to or less than half "
                  << "frame period";
    sptk::PrintErrorMessage("pitch2sin", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("pitch2sin", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("pitch2sin", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("pitch2sin", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::InputSourceFromStream input_source_from_stream(false, 1, &input_stream);
  sptk::InputSourceInterpolationWithMagicNumber
      input_source_interpolation_with_magic_number(
          frame_period, interpolation_period, false,
          kMagicNumberForUnvoicedFrame, &input_source_from_stream);
  if (!input_source_interpolation_with_magic_number.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize InputSourceFromStream";
    sptk::PrintErrorMessage("pitch2sin", error_message);
    return 1;
  }

  sptk::PeriodicWaveformGeneration waveform_generation(
      unvoiced_value, strict, &input_source_interpolation_with_magic_number);
  if (!waveform_generation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize PeriodicWaveformGeneration";
    sptk::PrintErrorMessage("pitch2sin", error_message);
    return 1;
  }

  double signal;
  while (waveform_generation.Get(kSine == output_format ? &signal : NULL,
                                 kCosine == output_format ? &signal : NULL,
                                 kSawtooth == output_format ? &signal : NULL,
                                 NULL)) {
    if (!sptk::WriteStream(signal, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write a periodic waveform";
      sptk::PrintErrorMessage("pitch2sin", error_message);
      return 1;
    }
  }

  return 0;
}